

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

void __thiscall
PlanningUnitMADPDiscrete::GetActionHistoryArrays
          (PlanningUnitMADPDiscrete *this,Index agentI,Index ahI,Index t,Index *aIs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Index IVar3;
  int iVar4;
  const_reference pvVar5;
  undefined8 uVar6;
  ulong uVar7;
  uint in_ECX;
  int in_EDX;
  undefined4 in_ESI;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  *in_RDI;
  long in_R8;
  undefined8 extraout_XMM0_Qa;
  undefined1 extraout_var [56];
  undefined1 auVar8 [64];
  undefined8 extraout_XMM1_Qa;
  undefined1 extraout_var_01 [56];
  undefined1 auVar9 [64];
  Index aI_t2;
  size_t b;
  size_t stage;
  Index t2;
  size_t nrA;
  size_t vec_size;
  Index remainder;
  Index ahIwithinThisT;
  size_type in_stack_ffffffffffffff98;
  uint local_3c;
  uint local_28;
  undefined1 extraout_var_00 [56];
  
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::at(in_RDI,in_stack_ffffffffffffff98);
  pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::at
                     ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)in_RDI,
                      in_stack_ffffffffffffff98);
  IVar3 = Globals::CastLIndexToIndex(*pvVar5);
  local_28 = in_EDX - IVar3;
  uVar6 = (**(code **)((long)&(in_RDI->
                              super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[2].
                              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                              ._M_impl.super__Vector_impl_data + 8))(in_RDI,in_ESI);
  auVar9._8_56_ = extraout_var_01;
  auVar9._0_8_ = extraout_XMM1_Qa;
  auVar8._8_56_ = extraout_var;
  auVar8._0_8_ = (double)extraout_XMM0_Qa;
  for (local_3c = 0; local_3c < in_ECX; local_3c = local_3c + 1) {
    auVar1 = vcvtusi2sd_avx512f(auVar8._0_16_,uVar6);
    auVar2 = vcvtusi2sd_avx512f(auVar9._0_16_,(ulong)(~local_3c + in_ECX));
    auVar9 = ZEXT1664(auVar2);
    auVar8._0_8_ = pow(auVar1._0_8_,auVar2._0_8_);
    auVar8._8_56_ = extraout_var_00;
    uVar7 = vcvttsd2usi_avx512f(auVar8._0_16_);
    iVar4 = (int)(local_28 / uVar7);
    *(int *)(in_R8 + (ulong)local_3c * 4) = iVar4;
    local_28 = local_28 - iVar4 * (int)uVar7;
  }
  return;
}

Assistant:

void 
PlanningUnitMADPDiscrete::GetActionHistoryArrays
    (Index agentI, Index ahI, Index t,  Index aIs[]) const
{
    //substract the offset to find out what is the index within the time-step-t-
    //action-histories.
    Index ahIwithinThisT = ahI - CastLIndexToIndex(_m_firstAHIforT.at(agentI).at(t));
   
    Index remainder = ahIwithinThisT;
    size_t vec_size = t; // the number of joint actions we are searching
    size_t nrA = GetNrActions(agentI);
    for(Index t2=0; t2 < vec_size ; t2++)
    {
        // for explanation see GetJointActionActionHistoryArrays()
        //
        // we start with stage
        size_t stage = (t-1) - t2;
        //we are going to calculate the joa that took place at time stage
        size_t b = (size_t) pow((double)nrA, (double)(stage));
        Index aI_t2 = remainder / b;
        aIs[t2] = aI_t2; 
        remainder -= aI_t2 * b;
    }
}